

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O2

string * __thiscall
hexpattern::guidregex_abi_cxx11_(string *__return_storage_ptr__,hexpattern *this)

{
  ByteMaskType BStack_48;
  
  getguidmask(&BStack_48,this);
  datamask2regex_abi_cxx11_(__return_storage_ptr__,this,&BStack_48);
  std::
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~pair(&BStack_48);
  return __return_storage_ptr__;
}

Assistant:

std::string guidregex()
    {
        return datamask2regex(getguidmask());
    }